

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O1

void __thiscall Am_Region_Impl::Push(Am_Region_Impl *this,Am_Region *the_region)

{
  iterator *piVar1;
  _XRegion *p_Var2;
  long lVar3;
  _Elt_pointer pp_Var4;
  long lVar5;
  Region new_region;
  _XRegion *local_20;
  
  p_Var2 = (_XRegion *)XCreateRegion();
  local_20 = p_Var2;
  lVar3 = __dynamic_cast(the_region,&Am_Region::typeinfo,&typeinfo,0);
  lVar5 = *(long *)(lVar3 + 0x38);
  if (lVar5 != *(long *)(lVar3 + 0x18)) {
    if (lVar5 == *(long *)(lVar3 + 0x40)) {
      lVar5 = *(long *)(*(long *)(lVar3 + 0x50) + -8) + 0x200;
    }
    XUnionRegion(*(undefined8 *)(lVar5 + -8),p_Var2,p_Var2);
  }
  pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var4 !=
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    if (pp_Var4 ==
        (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    XIntersectRegion(pp_Var4[-1],local_20);
  }
  pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pp_Var4 ==
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<_XRegion*,std::allocator<_XRegion*>>::_M_push_back_aux<_XRegion*const&>
              ((deque<_XRegion*,std::allocator<_XRegion*>> *)&this->stack,&local_20);
  }
  else {
    *pp_Var4 = local_20;
    piVar1 = &(this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void
Am_Region_Impl::Push(Am_Region *the_region)
{
  // Safely copy the given region into a new one
  Region new_region = XCreateRegion();
  Am_Region_Impl *the_region_impl = dynamic_cast<Am_Region_Impl *>(the_region);
  if ((the_region_impl->stack).empty() != true) {
    XUnionRegion((the_region_impl->stack).top(), new_region, new_region);
  }
  // Intersect with previous if needed
  if (stack.empty() != true) {
    XIntersectRegion(stack.top(), new_region, new_region);
  }
  // And push the new one
  stack.push(new_region);
}